

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prevector.h
# Opt level: O0

bool __thiscall
prevector<16U,_unsigned_char,_unsigned_int,_int>::operator==
          (prevector<16U,_unsigned_char,_unsigned_int,_int> *this,
          prevector<16U,_unsigned_char,_unsigned_int,_int> *other)

{
  long lVar1;
  const_iterator x;
  bool bVar2;
  size_type sVar3;
  size_type sVar4;
  byte *pbVar5;
  prevector<16U,_unsigned_char,_unsigned_int,_int> *in_RDI;
  long in_FS_OFFSET;
  const_iterator e1;
  const_iterator b2;
  const_iterator b1;
  undefined4 in_stack_ffffffffffffffa8;
  uint in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  undefined1 local_29;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  sVar3 = size((prevector<16U,_unsigned_char,_unsigned_int,_int> *)
               CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  sVar4 = size((prevector<16U,_unsigned_char,_unsigned_int,_int> *)
               CONCAT44(sVar3,in_stack_ffffffffffffffb8));
  if (sVar3 == sVar4) {
    begin(in_RDI);
    begin(in_RDI);
    end(in_RDI);
    while( true ) {
      x.ptr._4_4_ = sVar3;
      x.ptr._0_4_ = in_stack_ffffffffffffffb8;
      bVar2 = const_iterator::operator!=((const_iterator *)in_RDI,x);
      if (!bVar2) break;
      pbVar5 = const_iterator::operator*
                         ((const_iterator *)
                          CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      in_stack_ffffffffffffffac = (uint)*pbVar5;
      pbVar5 = const_iterator::operator*
                         ((const_iterator *)(ulong)CONCAT14(*pbVar5,in_stack_ffffffffffffffa8));
      if (in_stack_ffffffffffffffac != *pbVar5) {
        local_29 = false;
        goto LAB_00e0462d;
      }
      const_iterator::operator++
                ((const_iterator *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      const_iterator::operator++
                ((const_iterator *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    }
    local_29 = true;
  }
  else {
    local_29 = false;
  }
LAB_00e0462d:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_29;
  }
  __stack_chk_fail();
}

Assistant:

bool operator==(const prevector<N, T, Size, Diff>& other) const {
        if (other.size() != size()) {
            return false;
        }
        const_iterator b1 = begin();
        const_iterator b2 = other.begin();
        const_iterator e1 = end();
        while (b1 != e1) {
            if ((*b1) != (*b2)) {
                return false;
            }
            ++b1;
            ++b2;
        }
        return true;
    }